

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_cast.cpp
# Opt level: O1

bool duckdb::VectorStringToArray::StringToNestedTypeCastLoop
               (string_t *source_data,ValidityMask *source_mask,Vector *result,
               ValidityMask *result_mask,idx_t count,CastParameters *parameters,SelectionVector *sel
               )

{
  LogicalType *type;
  ulong *puVar1;
  unsigned_long *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  BoundCastData *pBVar4;
  bool bVar5;
  undefined1 auVar6 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  bool bVar8;
  byte bVar9;
  idx_t iVar10;
  idx_t iVar11;
  TemplatedValidityData<unsigned_long> *pTVar12;
  Vector *pVVar13;
  ConversionException *this;
  ulong uVar14;
  undefined1 uVar15;
  idx_t idx_in_entry;
  ulong uVar16;
  idx_t idx;
  char *pcVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1;
  idx_t idx_in_entry_1;
  string_t *psVar18;
  idx_t iVar19;
  idx_t total;
  string error;
  VectorTryCastData vector_cast_data;
  Vector varchar_vector;
  idx_t local_1e0;
  undefined1 local_1d8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  idx_t local_1b8;
  undefined1 local_1b0;
  idx_t local_1a8;
  buffer_ptr<ValidityBuffer> *local_1a0;
  string local_198;
  undefined1 *local_178 [2];
  undefined1 local_168 [16];
  undefined1 *local_158 [2];
  undefined1 local_148 [16];
  idx_t local_138;
  VectorTryCastData local_130;
  string local_118;
  undefined1 local_f8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_f0;
  element_type local_e8 [2];
  string_t *local_d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  string local_88;
  string local_68;
  LogicalType local_48;
  
  type = &result->type;
  params_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)count;
  iVar10 = ArrayType::GetSize(type);
  if (count == 0) {
    bVar5 = true;
  }
  else {
    bVar5 = true;
    uVar16 = 0;
    do {
      uVar14 = uVar16;
      if ((sel != (SelectionVector *)0x0) && (sel->sel_vector != (sel_t *)0x0)) {
        uVar14 = (ulong)sel->sel_vector[uVar16];
      }
      puVar2 = (source_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if ((puVar2 == (unsigned_long *)0x0) || ((puVar2[uVar14 >> 6] >> (uVar14 & 0x3f) & 1) != 0)) {
        psVar18 = source_data + uVar14;
        iVar11 = VectorStringToList::CountPartsList(psVar18);
        if (iVar10 != iVar11) {
          if (bVar5) {
            local_158[0] = local_148;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_158,
                       "Type VARCHAR with value \'%s\' can\'t be cast to the destination type %s, the size of the array must match the destination type"
                       ,"");
            uVar14 = (ulong)(psVar18->value).pointer.length;
            if (uVar14 < 0xd) {
              pcVar17 = (psVar18->value).pointer.prefix;
            }
            else {
              pcVar17 = (psVar18->value).pointer.ptr;
            }
            local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_118,pcVar17,pcVar17 + uVar14);
            LogicalType::ToString_abi_cxx11_(&local_68,type);
            StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
                      ((string *)local_f8,(StringUtil *)local_158,&local_118,&local_68,params_1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != &local_118.field_2) {
              operator_delete(local_118._M_dataplus._M_p);
            }
            if (local_158[0] != local_148) {
              operator_delete(local_158[0]);
            }
            if (parameters->strict == true) {
              this = (ConversionException *)__cxa_allocate_exception(0x10);
              ConversionException::ConversionException(this,(string *)local_f8);
              __cxa_throw(this,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
            }
            HandleCastError::AssignError
                      ((string *)local_f8,parameters->error_message,
                       (optional_idx)(parameters->query_location).index);
            if (local_f8 != (undefined1  [8])local_e8) {
              operator_delete((void *)local_f8);
            }
            bVar5 = false;
          }
          if ((result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
              (unsigned_long *)0x0) {
            local_1d8 = (undefined1  [8])
                        (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)local_f8,(unsigned_long *)local_1d8);
            p_Var7 = p_Stack_f0;
            auVar6 = local_f8;
            local_f8 = (undefined1  [8])0x0;
            p_Stack_f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var3 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)auVar6;
            (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var7;
            if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
            }
            if (p_Stack_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_f0);
            }
            pTVar12 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).
                                  validity_data);
            (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                 (unsigned_long *)
                 (pTVar12->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>;
          }
          bVar9 = (byte)uVar16 & 0x3f;
          puVar1 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                   (uVar16 >> 6);
          *puVar1 = *puVar1 & (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
        }
      }
      uVar16 = uVar16 + 1;
    } while (count != uVar16);
  }
  LogicalType::LogicalType(&local_48,VARCHAR);
  local_1a8 = iVar10 * count;
  Vector::Vector((Vector *)local_f8,&local_48,iVar10 * count);
  LogicalType::~LogicalType(&local_48);
  local_130.all_converted = true;
  local_1e0 = 0;
  local_130.result = result;
  local_130.parameters = parameters;
  if (count != 0) {
    local_1a0 = &(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data;
    iVar11 = 0;
    uVar16 = 0;
    do {
      uVar14 = uVar16;
      if ((sel != (SelectionVector *)0x0) && (sel->sel_vector != (sel_t *)0x0)) {
        uVar14 = (ulong)sel->sel_vector[uVar16];
      }
      puVar2 = (source_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (((puVar2 == (unsigned_long *)0x0) || ((puVar2[uVar14 >> 6] >> (uVar14 & 0x3f) & 1) != 0))
         && ((puVar2 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask,
             puVar2 == (unsigned_long *)0x0 || ((puVar2[uVar16 >> 6] >> (uVar16 & 0x3f) & 1) != 0)))
         ) {
        psVar18 = source_data + uVar14;
        bVar8 = VectorStringToList::SplitStringList(psVar18,local_d8,&local_1e0,(Vector *)local_f8);
        if (!bVar8) {
          local_178[0] = local_168;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_178,
                     "Type VARCHAR with value \'%s\' can\'t be cast to the destination type %s","");
          uVar14 = (ulong)(psVar18->value).pointer.length;
          if (uVar14 < 0xd) {
            pcVar17 = (psVar18->value).pointer.prefix;
          }
          else {
            pcVar17 = (psVar18->value).pointer.ptr;
          }
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_198,pcVar17,pcVar17 + uVar14);
          LogicalType::ToString_abi_cxx11_(&local_88,type);
          StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
                    ((string *)local_1d8,(StringUtil *)local_178,&local_198,&local_88,params_1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p);
          }
          if (local_178[0] != local_168) {
            operator_delete(local_178[0]);
          }
          HandleVectorCastError::Operation<duckdb::string_t>
                    ((string *)local_1d8,result_mask,uVar16,&local_130);
          if (local_1d8 != (undefined1  [8])&local_1c8) {
            operator_delete((void *)local_1d8);
          }
        }
      }
      else {
        if ((result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
            (unsigned_long *)0x0) {
          local_138 = (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_1d8,&local_138);
          p_Var7 = p_Stack_1d0;
          auVar6 = local_1d8;
          local_1d8 = (undefined1  [8])0x0;
          p_Stack_1d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var3 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)auVar6;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var7;
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
          }
          if (p_Stack_1d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1d0);
          }
          pTVar12 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (local_1a0);
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               (unsigned_long *)
               (pTVar12->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar9 = (byte)uVar16 & 0x3f;
        puVar1 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                 (uVar16 >> 6);
        *puVar1 = *puVar1 & (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
        idx = iVar11;
        for (iVar19 = iVar10; iVar19 != 0; iVar19 = iVar19 - 1) {
          FlatVector::SetNull((Vector *)local_f8,idx,true);
          idx = idx + 1;
        }
        local_1e0 = local_1e0 + iVar10;
      }
      uVar16 = uVar16 + 1;
      iVar11 = iVar11 + iVar10;
    } while (uVar16 != count);
  }
  pVVar13 = ArrayVector::GetEntry(result);
  optional_ptr<duckdb::BoundCastData,_true>::CheckValid(&parameters->cast_data);
  pBVar4 = (parameters->cast_data).ptr;
  local_1d8 = (undefined1  [8])pBVar4[3]._vptr_BoundCastData;
  p_Stack_1d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                CONCAT71(p_Stack_1d0._1_7_,parameters->strict);
  local_1c8._M_allocated_capacity._0_4_ = *(undefined4 *)&parameters->error_message;
  local_1c8._M_allocated_capacity._4_4_ = *(undefined4 *)((long)&parameters->error_message + 4);
  local_1c8._8_4_ = *(undefined4 *)&(parameters->local_state).ptr;
  local_1c8._12_4_ = *(undefined4 *)((long)&(parameters->local_state).ptr + 4);
  local_1b8 = (parameters->query_location).index;
  local_1b0 = 0;
  bVar9 = (*(code *)pBVar4[1]._vptr_BoundCastData)(local_f8,pVVar13,local_1a8);
  uVar15 = local_130.all_converted;
  if ((bVar9 & bVar5) != 1) {
    uVar15 = 0;
  }
  if (local_98._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98._M_pi);
  }
  if (local_a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8._M_pi);
  }
  if (local_c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0._M_pi);
  }
  LogicalType::~LogicalType((LogicalType *)&p_Stack_f0);
  return (bool)uVar15;
}

Assistant:

bool VectorStringToArray::StringToNestedTypeCastLoop(const string_t *source_data, ValidityMask &source_mask,
                                                     Vector &result, ValidityMask &result_mask, idx_t count,
                                                     CastParameters &parameters, const SelectionVector *sel) {
	idx_t array_size = ArrayType::GetSize(result.GetType());
	bool all_lengths_match = true;

	for (idx_t i = 0; i < count; i++) {
		idx_t idx = i;
		if (sel) {
			idx = sel->get_index(i);
		}
		if (!source_mask.RowIsValid(idx)) {
			continue;
		}
		auto str_array_size = VectorStringToList::CountPartsList(source_data[idx]);
		if (array_size != str_array_size) {
			if (all_lengths_match) {
				all_lengths_match = false;
				auto msg = StringUtil::Format("Type VARCHAR with value '%s' can't be cast to the destination type %s"
				                              ", the size of the array must match the destination type",
				                              source_data[idx].GetString(), result.GetType().ToString());
				if (parameters.strict) {
					throw ConversionException(msg);
				}
				HandleCastError::AssignError(msg, parameters);
			}
			result_mask.SetInvalid(i);
		}
	}

	auto child_count = array_size * count;
	Vector varchar_vector(LogicalType::VARCHAR, child_count);
	auto child_data = FlatVector::GetData<string_t>(varchar_vector);

	VectorTryCastData vector_cast_data(result, parameters);
	idx_t total = 0;
	for (idx_t i = 0; i < count; i++) {
		idx_t idx = i;
		if (sel) {
			idx = sel->get_index(i);
		}

		if (!source_mask.RowIsValid(idx) || !result_mask.RowIsValid(i)) {
			// The source is null, or there was a size-mismatch above, so dont try to split the string
			result_mask.SetInvalid(i);

			// Null the entire array
			for (idx_t j = 0; j < array_size; j++) {
				FlatVector::SetNull(varchar_vector, i * array_size + j, true);
			}

			total += array_size;
			continue;
		}

		if (!VectorStringToList::SplitStringList(source_data[idx], child_data, total, varchar_vector)) {
			auto error = StringUtil::Format("Type VARCHAR with value '%s' can't be cast to the destination type %s",
			                                source_data[idx].GetString(), result.GetType().ToString());
			HandleVectorCastError::Operation<string_t>(error, result_mask, i, vector_cast_data);
		}
	}
	D_ASSERT(total == child_count);

	auto &result_child = ArrayVector::GetEntry(result);
	auto &cast_data = parameters.cast_data->Cast<ArrayBoundCastData>();
	CastParameters child_parameters(parameters, cast_data.child_cast_info.cast_data, parameters.local_state);
	bool cast_result = cast_data.child_cast_info.function(varchar_vector, result_child, child_count, child_parameters);

	return all_lengths_match && cast_result && vector_cast_data.all_converted;
}